

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O2

TraceFormat cmake::StringToTraceFormat(string *traceStr)

{
  pointer ppVar1;
  __type _Var2;
  int iVar3;
  TraceFormat TVar4;
  pointer __lhs;
  long lVar5;
  pointer ppVar6;
  long lVar7;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::TraceFormat>_>
  __l;
  allocator_type local_89;
  TraceFormat local_88 [2];
  string traceStrLowCase;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::TraceFormat>
  local_58;
  
  if ((StringToTraceFormat(std::__cxx11::string_const&)::levels_abi_cxx11_ == '\0') &&
     (iVar3 = __cxa_guard_acquire(&StringToTraceFormat(std::__cxx11::string_const&)::
                                   levels_abi_cxx11_), iVar3 != 0)) {
    local_88[1] = 1;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::TraceFormat>
    ::pair<const_char_(&)[6],_cmake::TraceFormat,_true>
              ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::TraceFormat>
                *)&traceStrLowCase,(char (*) [6])"human",local_88 + 1);
    local_88[0] = TRACE_JSON_V1;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::TraceFormat>
    ::pair<const_char_(&)[8],_cmake::TraceFormat,_true>(&local_58,(char (*) [8])"json-v1",local_88);
    __l._M_len = 2;
    __l._M_array = (iterator)&traceStrLowCase;
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::TraceFormat>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::TraceFormat>_>_>
    ::vector(&StringToTraceFormat(std::__cxx11::string_const&)::levels_abi_cxx11_,__l,&local_89);
    lVar7 = 0x28;
    do {
      std::__cxx11::string::~string((string *)((long)&traceStrLowCase._M_dataplus._M_p + lVar7));
      lVar7 = lVar7 + -0x28;
    } while (lVar7 != -0x28);
    __cxa_atexit(std::
                 vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::TraceFormat>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::TraceFormat>_>_>
                 ::~vector,&StringToTraceFormat(std::__cxx11::string_const&)::levels_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&StringToTraceFormat(std::__cxx11::string_const&)::levels_abi_cxx11_);
  }
  cmsys::SystemTools::LowerCase(&traceStrLowCase,traceStr);
  ppVar1 = StringToTraceFormat(std::__cxx11::string_const&)::levels_abi_cxx11_.
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::TraceFormat>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::TraceFormat>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar7 = (long)StringToTraceFormat(std::__cxx11::string_const&)::levels_abi_cxx11_.
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::TraceFormat>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::TraceFormat>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)StringToTraceFormat(std::__cxx11::string_const&)::levels_abi_cxx11_.
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::TraceFormat>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::TraceFormat>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  __lhs = StringToTraceFormat(std::__cxx11::string_const&)::levels_abi_cxx11_.
          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::TraceFormat>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::TraceFormat>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
  for (lVar5 = lVar7 / 0x28 >> 2; 0 < lVar5; lVar5 = lVar5 + -1) {
    _Var2 = std::operator==(&__lhs->first,&traceStrLowCase);
    ppVar6 = __lhs;
    if (_Var2) goto LAB_001de742;
    _Var2 = std::operator==(&__lhs[1].first,&traceStrLowCase);
    ppVar6 = __lhs + 1;
    if (_Var2) goto LAB_001de742;
    _Var2 = std::operator==(&__lhs[2].first,&traceStrLowCase);
    ppVar6 = __lhs + 2;
    if (_Var2) goto LAB_001de742;
    _Var2 = std::operator==(&__lhs[3].first,&traceStrLowCase);
    ppVar6 = __lhs + 3;
    if (_Var2) goto LAB_001de742;
    __lhs = __lhs + 4;
    lVar7 = lVar7 + -0xa0;
  }
  lVar7 = lVar7 / 0x28;
  if (lVar7 != 1) {
    if (lVar7 != 2) {
      ppVar6 = ppVar1;
      if ((lVar7 != 3) ||
         (_Var2 = std::operator==(&__lhs->first,&traceStrLowCase), ppVar6 = __lhs, _Var2))
      goto LAB_001de742;
      __lhs = __lhs + 1;
    }
    _Var2 = std::operator==(&__lhs->first,&traceStrLowCase);
    ppVar6 = __lhs;
    if (_Var2) goto LAB_001de742;
    __lhs = __lhs + 1;
  }
  _Var2 = std::operator==(&__lhs->first,&traceStrLowCase);
  ppVar6 = ppVar1;
  if (_Var2) {
    ppVar6 = __lhs;
  }
LAB_001de742:
  if (ppVar6 == StringToTraceFormat(std::__cxx11::string_const&)::levels_abi_cxx11_.
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::TraceFormat>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::TraceFormat>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    TVar4 = TRACE_UNDEFINED;
  }
  else {
    TVar4 = ppVar6->second;
  }
  std::__cxx11::string::~string((string *)&traceStrLowCase);
  return TVar4;
}

Assistant:

cmake::TraceFormat cmake::StringToTraceFormat(const std::string& traceStr)
{
  using TracePair = std::pair<std::string, TraceFormat>;
  static const std::vector<TracePair> levels = {
    { "human", TraceFormat::TRACE_HUMAN },
    { "json-v1", TraceFormat::TRACE_JSON_V1 },
  };

  const auto traceStrLowCase = cmSystemTools::LowerCase(traceStr);

  const auto it = std::find_if(levels.cbegin(), levels.cend(),
                               [&traceStrLowCase](const TracePair& p) {
                                 return p.first == traceStrLowCase;
                               });
  return (it != levels.cend()) ? it->second : TraceFormat::TRACE_UNDEFINED;
}